

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::inverse(matrix3d *_m,matrix3d *inv_m,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  bool bVar7;
  linalg *plVar8;
  double d;
  double dVar9;
  matrix33d inv_m_1;
  mat<double,_3,_3> local_a8;
  linalg local_60 [72];
  
  dVar1 = _m->m[1][0];
  dVar9 = _m->m[1][1];
  dVar2 = _m->m[1][2];
  dVar3 = _m->m[2][0];
  dVar4 = _m->m[2][1];
  dVar5 = _m->m[2][2];
  dVar1 = ABS((dVar1 * dVar4 - dVar9 * dVar3) * _m->m[0][2] +
              (dVar9 * dVar5 - dVar2 * dVar4) * _m->m[0][0] +
              (dVar2 * dVar3 - dVar5 * dVar1) * _m->m[0][1]);
  bVar7 = true;
  if (eps < dVar1) {
    dVar9 = dVar1;
    if (dVar1 <= 0.0) {
      dVar9 = 0.0;
    }
    bVar7 = dVar1 <= dVar9 * eps;
  }
  if (bVar7 == false) {
    plVar8 = local_60;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)plVar8 = *(undefined8 *)_m;
      _m = (matrix3d *)((long)_m + 8);
      plVar8 = plVar8 + 8;
    }
    linalg::inverse<double,3>(&local_a8,local_60,(mat<double,_3,_3> *)local_60);
    inv_m->m[0][0] = local_a8.x.x;
    inv_m->m[0][1] = local_a8.x.y;
    inv_m->m[0][2] = local_a8.x.z;
    inv_m->m[1][0] = local_a8.y.x;
    inv_m->m[1][1] = local_a8.y.y;
    inv_m->m[1][2] = local_a8.y.z;
    inv_m->m[2][0] = local_a8.z.x;
    inv_m->m[2][1] = local_a8.z.y;
    inv_m->m[2][2] = local_a8.z.z;
  }
  return (bool)(bVar7 ^ 1);
}

Assistant:

bool inverse(const value::matrix3d &_m, value::matrix3d &inv_m, double eps) {
  double det = determinant(_m);

  if (math::is_close(std::fabs(det), 0.0, eps)) {
    return false;
  }

  inv_m = inverse(_m);
  return true;
}